

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall QMakeProperty::unsetProperty(QMakeProperty *this,QStringList *optionProperties)

{
  bool bVar1;
  const_iterator o;
  QMakeProperty *in_RDI;
  long in_FS_OFFSET;
  QString var;
  const_iterator it;
  undefined7 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9f;
  undefined1 local_40 [24];
  char *ch;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::cbegin((QList<QString> *)in_RDI);
  while( true ) {
    o = QList<QString>::cend((QList<QString> *)in_RDI);
    bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    ch = (char *)0xaaaaaaaaaaaaaaaa;
    QList<QString>::const_iterator::operator*(&local_10);
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QString::QString(o.i,ch);
    in_stack_ffffffffffffff9f =
         QString::startsWith((QString *)&stack0xffffffffffffffd8,(CaseSensitivity)local_40);
    in_stack_ffffffffffffff9f = in_stack_ffffffffffffff9f ^ 0xff;
    QString::~QString((QString *)0x335a5c);
    if ((in_stack_ffffffffffffff9f & 1) != 0) {
      remove(in_RDI,&stack0xffffffffffffffd8);
    }
    QString::~QString((QString *)0x335a7f);
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeProperty::unsetProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        if (!var.startsWith("."))
            remove(var);
    }
}